

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_node.cpp
# Opt level: O2

void duckdb::BaseNode<(unsigned_char)'\x10',_(duckdb::NType)4>::InsertChildInternal
               (BaseNode<(unsigned_char)__x10_,_(duckdb::NType)4> *n,uint8_t byte,Node child)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  
  bVar1 = n->count;
  uVar4 = (ulong)bVar1;
  for (uVar2 = 0; (uVar3 = uVar4, uVar4 != uVar2 && (uVar3 = uVar2, n->key[uVar2] < byte));
      uVar2 = uVar2 + 1) {
  }
  for (; uVar3 < uVar4; uVar4 = uVar4 - 1) {
    uVar5 = (int)uVar4 - 1;
    n->key[uVar4] = n->key[uVar5];
    n->children[uVar4].super_IndexPointer.data = n->children[uVar5].super_IndexPointer.data;
  }
  n->key[uVar3] = byte;
  n->children[uVar3].super_IndexPointer.data = (idx_t)child.super_IndexPointer.data;
  n->count = bVar1 + 1;
  return;
}

Assistant:

void BaseNode<CAPACITY, TYPE>::InsertChildInternal(BaseNode &n, const uint8_t byte, const Node child) {
	// Still space. Insert the child.
	uint8_t child_pos = 0;
	while (child_pos < n.count && n.key[child_pos] < byte) {
		child_pos++;
	}

	// Move children backwards to make space.
	for (uint8_t i = n.count; i > child_pos; i--) {
		n.key[i] = n.key[i - 1];
		n.children[i] = n.children[i - 1];
	}

	n.key[child_pos] = byte;
	n.children[child_pos] = child;
	n.count++;
}